

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMap.hpp
# Opt level: O2

usize __thiscall MultiMap<int,_bool>::count(MultiMap<int,_bool> *this,int *key)

{
  Iterator IVar1;
  usize uVar2;
  
  IVar1 = find(this,key);
  if (IVar1.item == (this->_end).item) {
    uVar2 = 0;
  }
  else {
    uVar2 = 1;
    while ((IVar1.item = (IVar1.item)->next, IVar1.item != (Item *)0x0 &&
           ((IVar1.item)->key == *key))) {
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

usize count(const T& key)
  {
    Iterator it = find(key);
    if(it == _end)
      return 0;
    usize count = 1;
    for(Item* item = it.item->next; item && item->key == key; item = item->next)
      ++count;
    return count;
  }